

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O1

void __thiscall VcprojGenerator::initPreLinkEventTools(VcprojGenerator *this)

{
  QMakeProject *this_00;
  long lVar1;
  QArrayData *pQVar2;
  char16_t *pcVar3;
  qsizetype qVar4;
  ProStringList *pPVar5;
  long in_FS_OFFSET;
  QLatin1String QVar6;
  QString local_90;
  QArrayDataPointer<QString> local_78;
  ProKey local_58;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  ProKey::ProKey(&local_58,"QMAKE_PRE_LINK");
  pPVar5 = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,&local_58);
  lVar1 = (pPVar5->super_QList<ProString>).d.size;
  if (&(local_58.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
    super___atomic_base<int>._M_i =
         ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
        super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (lVar1 != 0) {
    local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    ProKey::ProKey(&local_58,"QMAKE_PRE_LINK");
    (*(this->super_Win32MakefileGenerator).super_MakefileGenerator.super_QMakeSourceFileInfo.
      _vptr_QMakeSourceFileInfo[0x16])(&local_90,this,&local_58);
    VCToolBase::fixCommandLine((QStringList *)&local_78,&local_90);
    if (&(local_90.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_90.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_90.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_58.super_ProString.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.super_ProString.m_string.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.super_ProString.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<QString>::operator=
              (&(this->vcProject).Configuration.preLink.super_VCEventTool.CommandLine.d,&local_78);
    QVar6.m_data = (char *)0x2;
    QVar6.m_size = (qsizetype)&local_78;
    QtPrivate::QStringList_join((QList *)&local_58,QVar6);
    pQVar2 = &((this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.d)->
              super_QArrayData;
    pcVar3 = (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.ptr;
    (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.d =
         local_58.super_ProString.m_string.d.d;
    (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.ptr =
         local_58.super_ProString.m_string.d.ptr;
    qVar4 = (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.size;
    (this->vcProject).Configuration.preLink.super_VCEventTool.Description.d.size =
         local_58.super_ProString.m_string.d.size;
    local_58.super_ProString.m_string.d.d = (Data *)pQVar2;
    local_58.super_ProString.m_string.d.ptr = pcVar3;
    local_58.super_ProString.m_string.d.size = qVar4;
    if (pQVar2 != (QArrayData *)0x0) {
      LOCK();
      (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar2->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar2,2,0x10);
      }
    }
    (this->vcProject).Configuration.preLink.super_VCEventTool.ExcludedFromBuild = _False;
    QArrayDataPointer<QString>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initPreLinkEventTools()
{
    VCConfiguration &conf = vcProject.Configuration;
    if(!project->values("QMAKE_PRE_LINK").isEmpty()) {
        QStringList cmdline = VCToolBase::fixCommandLine(var("QMAKE_PRE_LINK"));
        conf.preLink.CommandLine = cmdline;
        conf.preLink.Description = cmdline.join(QLatin1String("\r\n"));
        conf.preLink.ExcludedFromBuild = _False;
    }
}